

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccs_test.cpp
# Opt level: O0

void __thiscall CcsTest_TemplatedBool_Test::TestBody(CcsTest_TemplatedBool_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_4e8;
  AssertHelper local_4c8;
  Message local_4c0;
  bool local_4b2;
  allocator local_4b1;
  string local_4b0;
  bool local_489;
  undefined1 local_488 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_458;
  Message local_450;
  bool local_442;
  allocator local_441;
  string local_440;
  bool local_419;
  undefined1 local_418 [8];
  AssertionResult gtest_ar__4;
  Message local_400;
  allocator local_3f1;
  string local_3f0;
  byte local_3c9;
  undefined1 local_3c8 [7];
  bool gtest_caught_any;
  AssertHelper local_3a8;
  Message local_3a0;
  allocator local_391;
  string local_390;
  bool local_369;
  undefined1 local_368 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_338;
  Message local_330;
  allocator local_321;
  string local_320;
  bool local_2f9;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_2c8;
  Message local_2c0;
  allocator local_2b1;
  string local_2b0;
  bool local_289;
  undefined1 local_288 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_258;
  Message local_250;
  allocator local_241;
  string local_240;
  bool local_219;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_;
  CcsContext ctx;
  string local_1f0;
  allocator local_1b9;
  string local_1b8 [32];
  istringstream local_198 [8];
  istringstream input;
  CcsDomain local_18;
  CcsDomain ccs;
  CcsTest_TemplatedBool_Test *this_local;
  
  ccs.dag._M_t.super___uniq_ptr_impl<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>._M_t.
  super__Tuple_impl<0UL,_ccs::DagBuilder_*,_std::default_delete<ccs::DagBuilder>_>.
  super__Head_base<0UL,_ccs::DagBuilder_*,_false>._M_head_impl =
       (unique_ptr<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>)
       (unique_ptr<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>)this;
  ::ccs::CcsDomain::CcsDomain(&local_18,false);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1b8,"a = true; b = \'true\'; c = false; d = \'false\'; e = \'1\'",&local_1b9);
  std::__cxx11::istringstream::istringstream(local_198,local_1b8,_S_in);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1f0,"<literal>",
             (allocator *)
             ((long)&ctx.searchState.
                     super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  ::ccs::CcsDomain::loadCcsStream
            (&local_18,(istream *)local_198,&local_1f0,
             (ImportResolver *)&::ccs::(anonymous_namespace)::NoImportResolver);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&ctx.searchState.
                     super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  ::ccs::CcsDomain::build((CcsDomain *)&gtest_ar_.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_240,"a",&local_241);
  local_219 = ::ccs::CcsContext::get<bool>((CcsContext *)&gtest_ar_.message_,&local_240);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_218,&local_219,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar1) {
    testing::Message::Message(&local_250);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_218,
               (AssertionResult *)"ctx.get<bool>(\"a\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0x7d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_258,&local_250);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b0,"b",&local_2b1);
  local_289 = ::ccs::CcsContext::get<bool>((CcsContext *)&gtest_ar_.message_,&local_2b0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_288,&local_289,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    testing::Message::Message(&local_2c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_288,
               (AssertionResult *)"ctx.get<bool>(\"b\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0x7e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2c8,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper(&local_2c8);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_2c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_320,"c",&local_321);
  bVar1 = ::ccs::CcsContext::get<bool>((CcsContext *)&gtest_ar_.message_,&local_320);
  local_2f9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2f8,&local_2f9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar1) {
    testing::Message::Message(&local_330);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_2f8,
               (AssertionResult *)"ctx.get<bool>(\"c\")","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0x7f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_338,&local_330);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_330);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_390,"d",&local_391);
  bVar1 = ::ccs::CcsContext::get<bool>((CcsContext *)&gtest_ar_.message_,&local_390);
  local_369 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_368,&local_369,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
  if (!bVar1) {
    testing::Message::Message(&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3c8,(internal *)local_368,(AssertionResult *)"ctx.get<bool>(\"d\")",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0x80,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3a8,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    std::__cxx11::string::~string((string *)local_3c8);
    testing::Message::~Message(&local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_3c9 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3f0,"e",&local_3f1);
      ::ccs::CcsContext::get<bool>((CcsContext *)&gtest_ar_.message_,&local_3f0);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
    }
    if ((local_3c9 & 1) != 0) goto LAB_0012f610;
  }
  testing::Message::Message(&local_400);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
             ,0x81,"Expected: ctx.get<bool>(\"e\") throws an exception.\n  Actual: it doesn\'t.");
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4.message_,&local_400);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
  testing::Message::~Message(&local_400);
LAB_0012f610:
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_440,"unset",&local_441);
  local_442 = true;
  local_419 = ::ccs::CcsContext::get<bool>((CcsContext *)&gtest_ar_.message_,&local_440,&local_442);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_418,&local_419,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator((allocator<char> *)&local_441);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar1) {
    testing::Message::Message(&local_450);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_418,
               (AssertionResult *)"ctx.get(\"unset\", true)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0x82,pcVar2);
    testing::internal::AssertHelper::operator=(&local_458,&local_450);
    testing::internal::AssertHelper::~AssertHelper(&local_458);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_450);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4b0,"unset",&local_4b1);
  local_4b2 = false;
  bVar1 = ::ccs::CcsContext::get<bool>((CcsContext *)&gtest_ar_.message_,&local_4b0,&local_4b2);
  local_489 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_488,&local_489,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
  if (!bVar1) {
    testing::Message::Message(&local_4c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_4e8,(internal *)local_488,(AssertionResult *)"ctx.get(\"unset\", false)",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0x83,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4c8,&local_4c0);
    testing::internal::AssertHelper::~AssertHelper(&local_4c8);
    std::__cxx11::string::~string((string *)&local_4e8);
    testing::Message::~Message(&local_4c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
  ::ccs::CcsContext::~CcsContext((CcsContext *)&gtest_ar_.message_);
  std::__cxx11::istringstream::~istringstream(local_198);
  ::ccs::CcsDomain::~CcsDomain(&local_18);
  return;
}

Assistant:

TEST(CcsTest, TemplatedBool) {
  CcsDomain ccs;
  std::istringstream input(
      "a = true; b = 'true'; c = false; d = 'false'; e = '1'");
  ccs.loadCcsStream(input, "<literal>", ImportResolver::None);
  CcsContext ctx = ccs.build();
  EXPECT_TRUE(ctx.get<bool>("a"));
  EXPECT_TRUE(ctx.get<bool>("b"));
  EXPECT_FALSE(ctx.get<bool>("c"));
  EXPECT_FALSE(ctx.get<bool>("d"));
  EXPECT_ANY_THROW(ctx.get<bool>("e"));
  EXPECT_TRUE(ctx.get("unset", true));
  EXPECT_FALSE(ctx.get("unset", false));
}